

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_projection.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ReplaceProjectionBindings
          (duckdb *this,LogicalProjection *proj,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr)

{
  pointer pEVar1;
  BoundColumnRefExpression *pBVar2;
  reference this_00;
  type expr_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *copy;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  if ((pEVar1->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expr);
    pBVar2 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar1->super_BaseExpression);
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(&(proj->super_LogicalOperator).expressions,(pBVar2->binding).column_index)
    ;
    pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[0x11])(this,pEVar1);
    if ((pBVar2->super_Expression).super_BaseExpression.alias._M_string_length != 0) {
      pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)this);
      ::std::__cxx11::string::_M_assign((string *)&(pEVar1->super_BaseExpression).alias);
    }
  }
  else {
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(expr);
    local_38._8_8_ = 0;
    local_20 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/pushdown/pushdown_projection.cpp:42:13)>
               ::_M_invoke;
    local_28 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/pushdown/pushdown_projection.cpp:42:13)>
               ::_M_manager;
    local_38._M_unused._M_object = proj;
    ExpressionIterator::EnumerateChildren
              (expr_00,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                        *)&local_38);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
    *(Expression **)this =
         (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
         .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

static unique_ptr<Expression> ReplaceProjectionBindings(LogicalProjection &proj, unique_ptr<Expression> expr) {
	if (expr->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &colref = expr->Cast<BoundColumnRefExpression>();
		D_ASSERT(colref.binding.table_index == proj.table_index);
		D_ASSERT(colref.binding.column_index < proj.expressions.size());
		D_ASSERT(colref.depth == 0);
		// replace the binding with a copy to the expression at the referenced index
		auto copy = proj.expressions[colref.binding.column_index]->Copy();
		if (!colref.alias.empty()) {
			copy->alias = colref.alias;
		}
		return copy;
	}
	ExpressionIterator::EnumerateChildren(
	    *expr, [&](unique_ptr<Expression> &child) { child = ReplaceProjectionBindings(proj, std::move(child)); });
	return expr;
}